

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc32.cpp
# Opt level: O0

uint32_t crc32_1byte(void *data,size_t length,uint32_t previousCrc32)

{
  byte *local_28;
  uint8_t *current;
  uint32_t crc;
  uint32_t previousCrc32_local;
  size_t length_local;
  void *data_local;
  
  current._0_4_ = previousCrc32 ^ 0xffffffff;
  local_28 = (byte *)data;
  _crc = length;
  while (_crc != 0) {
    current._0_4_ = (uint)current >> 8 ^ Crc32Lookup[0][(uint)current & 0xff ^ (uint)*local_28];
    local_28 = local_28 + 1;
    _crc = _crc - 1;
  }
  return (uint)current ^ 0xffffffff;
}

Assistant:

uint32_t crc32_1byte(const void* data, size_t length, uint32_t previousCrc32 = 0)
{
  uint32_t crc = ~previousCrc32; // same as previousCrc32 ^ 0xFFFFFFFF
  const uint8_t* current = (const uint8_t*) data;

  while (length-- > 0)
    crc = (crc >> 8) ^ Crc32Lookup[0][(crc & 0xFF) ^ *current++];

  return ~crc; // same as crc ^ 0xFFFFFFFF
}